

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,double,duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *state;
  double *target;
  ulong in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  double *rdata_1;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **sdata_1;
  AggregateFinalizeData finalize_data;
  double *rdata;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **sdata;
  ulong local_80;
  AggregateFinalizeData local_78;
  double *local_60;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **local_58;
  AggregateFinalizeData *in_stack_ffffffffffffffc0;
  double *in_stack_ffffffffffffffc8;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *in_stack_ffffffffffffffd0;
  
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    state = (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)
            ConstantVector::
            GetData<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>*>
                      ((Vector *)0xa710b0);
    target = ConstantVector::GetData<double>((Vector *)0xa710bf);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffffb0,in_RDX,in_RSI);
    QuantileScalarOperation<false,duckdb::QuantileStandardType>::
    Finalize<double,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
              (state,target,in_stack_ffffffffffffffc0);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    local_58 = FlatVector::
               GetData<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>*>
                         ((Vector *)0xa7110d);
    local_60 = FlatVector::GetData<double>((Vector *)0xa7111c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,in_RDX,in_RSI);
    for (local_80 = 0; local_80 < in_RCX; local_80 = local_80 + 1) {
      local_78.result_idx = local_80 + in_R8;
      QuantileScalarOperation<false,duckdb::QuantileStandardType>::
      Finalize<double,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}